

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgaimage.cpp
# Opt level: O0

bool __thiscall TGAImage::write_tga_file(TGAImage *this,string *filename,bool v_flip,bool rle)

{
  byte bVar1;
  bool bVar2;
  ostream *poVar3;
  uchar *puVar4;
  undefined1 local_26a [8];
  TGA_Header header;
  string local_248 [8];
  ofstream out;
  char acStack_48 [8];
  uint8_t footer [18];
  undefined4 local_2c;
  undefined4 local_28;
  uint8_t extension_area_ref [4];
  uint8_t developer_area_ref [4];
  bool rle_local;
  bool v_flip_local;
  string *filename_local;
  TGAImage *this_local;
  
  local_28 = 0;
  local_2c = 0;
  builtin_strncpy(acStack_48,"TRUEVISI",8);
  builtin_memcpy(footer,"ON-XFILE.",10);
  extension_area_ref[2] = rle;
  extension_area_ref[3] = v_flip;
  std::ofstream::ofstream(local_248);
  std::ofstream::open(local_248,(_Ios_Openmode)filename);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"can\'t open file ");
    poVar3 = std::operator<<(poVar3,(string *)filename);
    std::operator<<(poVar3,"\n");
    std::ofstream::close();
    this_local._7_1_ = false;
  }
  else {
    TGA_Header::TGA_Header((TGA_Header *)local_26a);
    header.x_origin._0_1_ = (undefined1)(this->bytespp << 3);
    header._4_2_ = SUB42(this->width,0);
    header._6_2_ = SUB42(this->height,0);
    if (this->bytespp == 1) {
      local_26a[2] = '\x03';
      if ((extension_area_ref[2] & 1) != 0) {
        local_26a[2] = '\v';
      }
    }
    else {
      local_26a[2] = '\x02';
      if ((extension_area_ref[2] & 1) != 0) {
        local_26a[2] = '\n';
      }
    }
    header.x_origin._1_1_ = (~extension_area_ref[3] & 1) << 5;
    std::ostream::write((char *)local_248,(long)local_26a);
    bVar1 = std::ios::good();
    if ((bVar1 & 1) == 0) {
      std::ofstream::close();
      std::operator<<((ostream *)&std::cerr,"can\'t dump the tga file\n");
      this_local._7_1_ = false;
    }
    else {
      if ((extension_area_ref[2] & 1) == 0) {
        puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->data);
        std::ostream::write((char *)local_248,(long)puVar4);
        bVar1 = std::ios::good();
        if ((bVar1 & 1) == 0) {
          std::operator<<((ostream *)&std::cerr,"can\'t unload raw data\n");
          std::ofstream::close();
          this_local._7_1_ = false;
          goto LAB_00108e10;
        }
      }
      else {
        bVar2 = unload_rle_data(this,(ofstream *)local_248);
        if (!bVar2) {
          std::ofstream::close();
          std::operator<<((ostream *)&std::cerr,"can\'t unload rle data\n");
          this_local._7_1_ = false;
          goto LAB_00108e10;
        }
      }
      std::ostream::write((char *)local_248,(long)&local_28);
      bVar1 = std::ios::good();
      if ((bVar1 & 1) == 0) {
        std::operator<<((ostream *)&std::cerr,"can\'t dump the tga file\n");
        std::ofstream::close();
        this_local._7_1_ = false;
      }
      else {
        std::ostream::write((char *)local_248,(long)&local_2c);
        bVar1 = std::ios::good();
        if ((bVar1 & 1) == 0) {
          std::operator<<((ostream *)&std::cerr,"can\'t dump the tga file\n");
          std::ofstream::close();
          this_local._7_1_ = false;
        }
        else {
          std::ostream::write((char *)local_248,(long)acStack_48);
          bVar1 = std::ios::good();
          if ((bVar1 & 1) == 0) {
            std::operator<<((ostream *)&std::cerr,"can\'t dump the tga file\n");
            std::ofstream::close();
            this_local._7_1_ = false;
          }
          else {
            std::ofstream::close();
            this_local._7_1_ = true;
          }
        }
      }
    }
  }
LAB_00108e10:
  header.y_origin = 1;
  header.width = 0;
  std::ofstream::~ofstream(local_248);
  return this_local._7_1_;
}

Assistant:

bool TGAImage::write_tga_file(const std::string filename, const bool v_flip, const bool rle) const
{
    std::uint8_t developer_area_ref[4] = {0, 0, 0, 0};
    std::uint8_t extension_area_ref[4] = {0, 0, 0, 0};
    std::uint8_t footer[18] = {'T', 'R', 'U', 'E', 'V', 'I', 'S', 'I', 'O',
                               'N', '-', 'X', 'F', 'I', 'L', 'E', '.', '\0'};
    std::ofstream out;
    out.open(filename, std::ios::binary);
    if (!out.is_open()) {
        std::cerr << "can't open file " << filename << "\n";
        out.close();
        return false;
    }
    TGA_Header header;
    header.bitsperpixel = bytespp << 3;
    header.width = width;
    header.height = height;
    header.datatypecode = (bytespp == GRAYSCALE ? (rle ? 11 : 3) : (rle ? 10 : 2));
    header.imagedescriptor = v_flip ? 0x00 : 0x20;  // top-left or bottom-left origin
    out.write(reinterpret_cast<const char *>(&header), sizeof(header));
    if (!out.good()) {
        out.close();
        std::cerr << "can't dump the tga file\n";
        return false;
    }
    if (!rle) {
        out.write(reinterpret_cast<const char *>(data.data()), width * height * bytespp);
        if (!out.good()) {
            std::cerr << "can't unload raw data\n";
            out.close();
            return false;
        }
    } else {
        if (!unload_rle_data(out)) {
            out.close();
            std::cerr << "can't unload rle data\n";
            return false;
        }
    }
    out.write(reinterpret_cast<const char *>(developer_area_ref), sizeof(developer_area_ref));
    if (!out.good()) {
        std::cerr << "can't dump the tga file\n";
        out.close();
        return false;
    }
    out.write(reinterpret_cast<const char *>(extension_area_ref), sizeof(extension_area_ref));
    if (!out.good()) {
        std::cerr << "can't dump the tga file\n";
        out.close();
        return false;
    }
    out.write(reinterpret_cast<const char *>(footer), sizeof(footer));
    if (!out.good()) {
        std::cerr << "can't dump the tga file\n";
        out.close();
        return false;
    }
    out.close();
    return true;
}